

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

int get_versionless(FileName *varray,char *file,char *dir)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (varray->version_no != 0xffffffff) {
    for (; varray->version_no != 0xffffffff; varray = varray + 1) {
      pcVar1 = dir;
      pcVar3 = dir;
      if (varray->version_no == 0) {
        for (; (pcVar4 = pcVar3, *pcVar3 == '/' || (pcVar4 = pcVar1, *pcVar3 != '\0'));
            pcVar3 = pcVar3 + 1) {
          pcVar1 = pcVar4;
        }
        if (pcVar3 + -1 == pcVar1) {
          if (pcVar1 == dir) {
            file[0] = '/';
            file[1] = '\0';
          }
          else {
            strcpy(file,dir);
          }
        }
        else {
          strcpy(file,dir);
          sVar2 = strlen(file);
          (file + sVar2)[0] = '/';
          (file + sVar2)[1] = '\0';
        }
        strcat(file,varray->name);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int get_versionless(FileName *varray, char *file, char *dir)
{
#ifdef DOS
  return (0);
#endif /* DOS */
  if (NoFileP(varray)) return (0);

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no == 0) {
      ConcDirAndName(dir, varray->name, file);
      return (1);
    } else
      varray++;
  }
  return (0);
}